

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jsoncons::
value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::convert(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
         value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         *this,long value,semantic_tag param_2,error_code *param_3)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::from_integer<long,std::__cxx11::string>(value,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Into convert(From value, semantic_tag, std::error_code&)
        {
            Into s(this->get_allocator());
            jsoncons::detail::from_integer(value, s);
            return s;
        }